

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,cmGeneratorTarget *target,string *lang,bool forceFullPaths,bool forResponseFile,
          string *config)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  pointer dir;
  char *pcVar11;
  undefined3 in_register_00000089;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  string flagVar;
  string sysFwSearchFlagVar;
  string fwSearchFlagVar;
  string sysFlagVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream includeFlags;
  undefined1 auStack_328 [10];
  char local_31e;
  char local_31d;
  OutputFormat local_31c;
  string local_318;
  cmLocalGenerator *local_2f8;
  char *local_2f0;
  cmGeneratorTarget *local_2e8;
  char *local_2e0;
  undefined4 local_2d4;
  string local_2d0;
  string local_2b0;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_270;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string *local_1e8;
  cmOutputConverter *local_1e0;
  undefined1 local_1d8 [32];
  _Base_ptr local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [376];
  
  local_2d4 = CONCAT31(in_register_00000089,forceFullPaths);
  local_2e8 = target;
  local_270 = includes;
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"CMAKE_INCLUDE_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(lang->_M_dataplus)._M_p);
    local_288 = cmMakefile::GetSafeDefinition(this->Makefile,&local_2b0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_2b0,0,(char *)local_2b0._M_string_length,0x4f66c4);
    std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(lang->_M_dataplus)._M_p);
    local_2e0 = cmMakefile::GetDefinition(this->Makefile,&local_2b0);
    pcVar1 = this->Makefile;
    local_1d8._0_8_ = local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_278 = cmMakefile::GetDefinition(pcVar1,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    local_280 = " ";
    if (local_2e0 != (char *)0x0) {
      local_280 = local_2e0;
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"CMAKE_INCLUDE_SYSTEM_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_208,(ulong)(lang->_M_dataplus)._M_p);
    if (local_2e0 == (char *)0x0) {
      local_2f0 = cmMakefile::GetDefinition(this->Makefile,&local_208);
    }
    else {
      local_2f0 = (char *)0x0;
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"CMAKE_","");
    local_1e8 = __return_storage_ptr__;
    std::__cxx11::string::_M_append((char *)&local_228,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_228);
    local_2f8 = this;
    pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_228);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_248);
    local_290 = cmMakefile::GetDefinition(local_2f8->Makefile,&local_248);
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._8_4_ = _S_red;
    local_1d8._16_8_ = 0;
    local_1b0 = 0;
    dir = (local_270->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    local_1b8 = (_Base_ptr)local_1d8._24_8_;
    if (dir != (local_270->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      local_31c = (uint)forResponseFile * 2 + SHELL;
      local_31d = local_2f0 != (char *)0x0 && local_2e8 != (cmGeneratorTarget *)0x0;
      local_31e = local_290 != (char *)0x0 && local_2e8 != (cmGeneratorTarget *)0x0;
      local_1e0 = &local_2f8->super_cmOutputConverter;
      bVar4 = 0;
      do {
        if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
          bVar7 = false;
LAB_002bdd9e:
          bVar5 = bVar7;
          bVar7 = false;
        }
        else {
          pcVar1 = local_2f8->Makefile;
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"APPLE","");
          bVar6 = cmMakefile::IsOn(pcVar1,&local_268);
          bVar5 = true;
          bVar7 = true;
          if (!bVar6) goto LAB_002bdd9e;
          bVar7 = cmSystemTools::IsPathToFramework((dir->_M_dataplus)._M_p);
        }
        if ((bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2)) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (bVar7 == false) {
          if (!(bool)(local_2e0 != (char *)0x0 & bVar4)) {
            if (local_31d == '\0') {
              pcVar11 = local_288;
              if (local_288 != (char *)0x0) goto LAB_002bdf41;
            }
            else {
              bVar7 = cmGeneratorTarget::IsSystemIncludeDirectory(local_2e8,dir,config);
              pcVar11 = local_288;
              if (bVar7) {
                pcVar11 = local_2f0;
              }
              if ((~bVar7 & local_288 == (char *)0x0) == 0) {
LAB_002bdf41:
                sVar9 = strlen(pcVar11);
                bVar4 = 1;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar11,sVar9);
                goto LAB_002bdf5f;
              }
            }
            bVar4 = 1;
            std::ios::clear((int)auStack_328 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x180
                           );
          }
LAB_002bdf5f:
          (*local_2f8->_vptr_cmLocalGenerator[8])
                    (&local_318,local_2f8,dir,(ulong)local_31c,(ulong)(byte)local_2d4);
          if (((local_278 != (char *)0x0) && (local_318._M_string_length != 0)) &&
             (*local_318._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
          if (((local_278 != (char *)0x0) && (local_318._M_string_length != 0)) &&
             (*local_318._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          pcVar11 = local_280;
          sVar9 = strlen(local_280);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          pcVar2 = (dir->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,pcVar2,pcVar2 + dir->_M_string_length);
          std::__cxx11::string::append((char *)&local_318);
          cmsys::SystemTools::CollapseFullPath(&local_2d0,&local_318);
          std::__cxx11::string::operator=((string *)&local_318,(string *)&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          pVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_1d8,&local_318);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar11 = pcVar8;
            if (local_31e == '\0') {
              if (pcVar8 == (char *)0x0) goto LAB_002bde94;
LAB_002be055:
              sVar9 = strlen(pcVar11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9)
              ;
            }
            else {
              bVar7 = cmGeneratorTarget::IsSystemIncludeDirectory(local_2e8,dir,config);
              if (bVar7) {
                pcVar11 = local_290;
              }
              if (pcVar8 != (char *)0x0 || bVar7) goto LAB_002be055;
LAB_002bde94:
              std::ios::clear((int)auStack_328 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                              0x180);
            }
            cmOutputConverter::ConvertToOutputFormat(&local_2d0,local_1e0,&local_318,local_31c);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_2d0._M_dataplus._M_p,
                                 local_2d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
        }
        dir = dir + 1;
      } while (dir != (local_270->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
    __return_storage_ptr__ = local_1e8;
    std::__cxx11::stringbuf::str();
    if (((*local_280 != ' ') && (sVar3 = __return_storage_ptr__->_M_string_length, sVar3 != 0)) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar2[sVar3 - 1] == *local_280)) {
      pcVar2[sVar3 - 1] = ' ';
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
                                     const std::vector<std::string> &includes,
                                     cmGeneratorTarget* target,
                                     const std::string& lang,
                                     bool forceFullPaths,
                                     bool forResponseFile,
                                     const std::string& config)
{
  if(lang.empty())
    {
    return "";
    }

  OutputFormat shellFormat = forResponseFile? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  const char* includeFlag =
    this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if(this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS"))
    {
    quotePaths = true;
    }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if(!sep)
    {
    sep = " ";
    }
  else
    {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
    }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = 0;
  if(repeatFlag)
    {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
    }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  std::vector<std::string>::const_iterator i;
  for(i = includes.begin(); i != includes.end(); ++i)
    {
    if(fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE")
       && cmSystemTools::IsPathToFramework(i->c_str()))
      {
      std::string frameworkDir = *i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if(emitted.insert(frameworkDir).second)
        {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(*i, config))
          {
          includeFlags << sysFwSearchFlag;
          }
        else
          {
          includeFlags << fwSearchFlag;
          }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
          << " ";
        }
      continue;
      }

    if(!flagUsed || repeatFlag)
      {
      if(sysIncludeFlag && target &&
         target->IsSystemIncludeDirectory(*i, config))
        {
        includeFlags << sysIncludeFlag;
        }
      else
        {
        includeFlags << includeFlag;
        }
      flagUsed = true;
      }
    std::string includePath =
      this->ConvertToIncludeReference(*i, shellFormat, forceFullPaths);
    if(quotePaths && !includePath.empty() && includePath[0] != '\"')
      {
      includeFlags << "\"";
      }
    includeFlags << includePath;
    if(quotePaths && !includePath.empty() && includePath[0] != '\"')
      {
      includeFlags << "\"";
      }
    includeFlags << sep;
    }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if((sep[0] != ' ') && !flags.empty() && flags[flags.size()-1] == sep[0])
    {
    flags[flags.size()-1] = ' ';
    }
  return flags;
}